

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

uint32_t helper_pmovmskb_xmm_x86_64(CPUX86State *env,ZMMReg *s)

{
  uint32_t val;
  ZMMReg *s_local;
  CPUX86State *env_local;
  
  return (s->_b_ZMMReg[0xf] & 0x80) << 8 |
         (s->_b_ZMMReg[0xe] & 0x80) << 7 |
         (s->_b_ZMMReg[0xd] & 0x80) << 6 |
         (s->_b_ZMMReg[0xc] & 0x80) << 5 |
         (s->_b_ZMMReg[0xb] & 0x80) << 4 |
         (s->_b_ZMMReg[10] & 0x80) << 3 |
         (s->_b_ZMMReg[9] & 0x80) << 2 |
         (s->_b_ZMMReg[8] & 0x80) << 1 |
         s->_b_ZMMReg[7] & 0x80 |
         (int)(uint)s->_b_ZMMReg[6] >> 1 & 0x40U |
         (int)(uint)s->_b_ZMMReg[5] >> 2 & 0x20U |
         (int)(uint)s->_b_ZMMReg[4] >> 3 & 0x10U |
         (int)(uint)s->_b_ZMMReg[3] >> 4 & 8U |
         (int)(uint)s->_b_ZMMReg[2] >> 5 & 4U |
         (int)(uint)s->_b_ZMMReg[1] >> 6 & 2U | (int)(uint)s->_b_ZMMReg[0] >> 7;
}

Assistant:

uint32_t glue(helper_pmovmskb, SUFFIX)(CPUX86State *env, Reg *s)
{
    uint32_t val;

    val = 0;
    val |= (s->B(0) >> 7);
    val |= (s->B(1) >> 6) & 0x02;
    val |= (s->B(2) >> 5) & 0x04;
    val |= (s->B(3) >> 4) & 0x08;
    val |= (s->B(4) >> 3) & 0x10;
    val |= (s->B(5) >> 2) & 0x20;
    val |= (s->B(6) >> 1) & 0x40;
    val |= (s->B(7)) & 0x80;
#if SHIFT == 1
    val |= (s->B(8) << 1) & 0x0100;
    val |= (s->B(9) << 2) & 0x0200;
    val |= (s->B(10) << 3) & 0x0400;
    val |= (s->B(11) << 4) & 0x0800;
    val |= (s->B(12) << 5) & 0x1000;
    val |= (s->B(13) << 6) & 0x2000;
    val |= (s->B(14) << 7) & 0x4000;
    val |= (s->B(15) << 8) & 0x8000;
#endif
    return val;
}